

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.cpp
# Opt level: O1

ON_SHA1_Hash * __thiscall
ON_SubDEdge::TopologyHash
          (ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdge *this,bool bIncludeSubdivisionProperties
          )

{
  ON_SubDVertex *this_00;
  ulong uVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  uint i;
  uint evi;
  long lVar6;
  ON_SubDFacePtr *pOVar7;
  ON_SubDEdgeSharpness s;
  ON_SubDEdgeSharpness local_c0;
  ON_SHA1 local_b8;
  
  local_b8.m_state[2] = 0;
  local_b8.m_state[3] = 0;
  local_b8.m_state[4] = 0;
  local_b8.m_bit_count[0] = 0;
  local_b8.m_bit_count[1] = 0;
  local_b8.m_state[0] = 0;
  local_b8.m_state[1] = 0;
  local_b8.m_buffer[0x30] = '\0';
  local_b8.m_buffer[0x31] = '\0';
  local_b8.m_buffer[0x32] = '\0';
  local_b8.m_buffer[0x33] = '\0';
  local_b8.m_buffer[0x34] = '\0';
  local_b8.m_buffer[0x35] = '\0';
  local_b8.m_buffer[0x36] = '\0';
  local_b8.m_buffer[0x37] = '\0';
  local_b8.m_buffer[0x38] = '\0';
  local_b8.m_buffer[0x39] = '\0';
  local_b8.m_buffer[0x3a] = '\0';
  local_b8.m_buffer[0x3b] = '\0';
  local_b8.m_buffer[0x3c] = '\0';
  local_b8.m_buffer[0x3d] = '\0';
  local_b8.m_buffer[0x3e] = '\0';
  local_b8.m_buffer[0x3f] = '\0';
  local_b8.m_buffer[0x20] = '\0';
  local_b8.m_buffer[0x21] = '\0';
  local_b8.m_buffer[0x22] = '\0';
  local_b8.m_buffer[0x23] = '\0';
  local_b8.m_buffer[0x24] = '\0';
  local_b8.m_buffer[0x25] = '\0';
  local_b8.m_buffer[0x26] = '\0';
  local_b8.m_buffer[0x27] = '\0';
  local_b8.m_buffer[0x28] = '\0';
  local_b8.m_buffer[0x29] = '\0';
  local_b8.m_buffer[0x2a] = '\0';
  local_b8.m_buffer[0x2b] = '\0';
  local_b8.m_buffer[0x2c] = '\0';
  local_b8.m_buffer[0x2d] = '\0';
  local_b8.m_buffer[0x2e] = '\0';
  local_b8.m_buffer[0x2f] = '\0';
  local_b8.m_buffer[0x10] = '\0';
  local_b8.m_buffer[0x11] = '\0';
  local_b8.m_buffer[0x12] = '\0';
  local_b8.m_buffer[0x13] = '\0';
  local_b8.m_buffer[0x14] = '\0';
  local_b8.m_buffer[0x15] = '\0';
  local_b8.m_buffer[0x16] = '\0';
  local_b8.m_buffer[0x17] = '\0';
  local_b8.m_buffer[0x18] = '\0';
  local_b8.m_buffer[0x19] = '\0';
  local_b8.m_buffer[0x1a] = '\0';
  local_b8.m_buffer[0x1b] = '\0';
  local_b8.m_buffer[0x1c] = '\0';
  local_b8.m_buffer[0x1d] = '\0';
  local_b8.m_buffer[0x1e] = '\0';
  local_b8.m_buffer[0x1f] = '\0';
  local_b8.m_buffer[0] = '\0';
  local_b8.m_buffer[1] = '\0';
  local_b8.m_buffer[2] = '\0';
  local_b8.m_buffer[3] = '\0';
  local_b8.m_buffer[4] = '\0';
  local_b8.m_buffer[5] = '\0';
  local_b8.m_buffer[6] = '\0';
  local_b8.m_buffer[7] = '\0';
  local_b8.m_buffer[8] = '\0';
  local_b8.m_buffer[9] = '\0';
  local_b8.m_buffer[10] = '\0';
  local_b8.m_buffer[0xb] = '\0';
  local_b8.m_buffer[0xc] = '\0';
  local_b8.m_buffer[0xd] = '\0';
  local_b8.m_buffer[0xe] = '\0';
  local_b8.m_buffer[0xf] = '\0';
  local_b8.m_byte_count = 0;
  local_b8.m_status_bits = 0;
  local_b8.m_reserved = 0;
  ON_SHA1_Hash::ON_SHA1_Hash(&local_b8.m_sha1_hash);
  ON_SHA1::AccumulateInteger32(&local_b8,(this->super_ON_SubDComponentBase).m_id);
  if ((int)CONCAT71(in_register_00000011,bIncludeSubdivisionProperties) != 0) {
    local_c0 = Sharpness(this,true);
    dVar2 = ON_SubDEdgeSharpness::operator[](&local_c0,0);
    ON_SHA1::AccumulateDouble(&local_b8,dVar2);
    dVar2 = ON_SubDEdgeSharpness::operator[](&local_c0,1);
    ON_SHA1::AccumulateDouble(&local_b8,dVar2);
  }
  lVar6 = 0;
  do {
    this_00 = this->m_vertex[lVar6];
    if (this_00 == (ON_SubDVertex *)0x0) {
      ON_SHA1::AccumulateInteger32(&local_b8,-1);
    }
    else {
      ON_SHA1::AccumulateInteger32(&local_b8,(this_00->super_ON_SubDComponentBase).m_id);
      if (bIncludeSubdivisionProperties) {
        ON_SHA1::AccumulateDoubleArray(&local_b8,3,this_00->m_P);
        bVar3 = ON_SubDVertex::IsDartOrCreaseOrCorner(this_00);
        if (bVar3) {
          ON_SHA1::AccumulateDouble(&local_b8,this->m_sector_coefficient[lVar6]);
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  ON_SHA1::AccumulateInteger16(&local_b8,this->m_face_count);
  if (this->m_face_count != 0) {
    pOVar7 = this->m_face2;
    uVar5 = 0;
    do {
      if ((uVar5 == 2) && (pOVar7 = this->m_facex, pOVar7 == (ON_SubDFacePtr *)0x0)) {
        if (2 < this->m_face_count) {
          uVar5 = 2;
          do {
            ON_SHA1::AccumulateInteger32(&local_b8,-1);
            uVar5 = uVar5 + 1;
          } while (uVar5 < this->m_face_count);
        }
        break;
      }
      uVar1 = pOVar7->m_ptr;
      uVar4 = uVar1 & 0xfffffffffffffff8;
      if (uVar4 == 0) {
        i = 0xffffffff;
      }
      else {
        ON_SHA1::AccumulateInteger32(&local_b8,*(ON__INT32 *)(uVar4 + 8));
        i = (uint)uVar1 & 1;
      }
      pOVar7 = pOVar7 + 1;
      ON_SHA1::AccumulateInteger32(&local_b8,i);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_face_count);
  }
  ON_SHA1::Hash(__return_storage_ptr__,&local_b8);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdge::TopologyHash(bool bIncludeSubdivisionProperties) const
{
  ON_SHA1 sha1;
  sha1.AccumulateInteger32(m_id);
  if (bIncludeSubdivisionProperties)
  {
    // passing true here includes the edge tag in the hash.
    const ON_SubDEdgeSharpness s = this->Sharpness(true);
    sha1.AccumulateDouble(s[0]);
    sha1.AccumulateDouble(s[1]);
  }
  for (unsigned evi = 0; evi < 2; ++evi)
  {
    const ON_SubDVertex* v = this->m_vertex[evi];    
    if (nullptr == v)
      sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
    else
    {
      sha1.AccumulateInteger32(v->m_id);
      if (bIncludeSubdivisionProperties)
      {
        sha1.AccumulateDoubleArray(3, v->m_P);
        if (v->IsDartOrCreaseOrCorner())
          sha1.AccumulateDouble(this->m_sector_coefficient[evi]);
      }
    }
  }

  sha1.AccumulateInteger16(this->m_face_count);
  const ON_SubDFacePtr* ef = this->m_face2;
  for (unsigned short efi = 0; efi < this->m_face_count; ++efi)
  {
    if (2 == efi)
    {
      ef = this->m_facex;
      if (nullptr == ef)
      {
        while (efi < this->m_face_count)
        {
          sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
          ++efi;
        }
        break;
      }
    }
    const ON_SubDFacePtr fptr = *ef++;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr.m_ptr);
    if (nullptr == f)
    {
      sha1.AccumulateInteger32(ON_UNSET_UINT_INDEX);
    }
    else
    {
      sha1.AccumulateInteger32(f->m_id);
      sha1.AccumulateInteger32((ON__UINT32)ON_SUBD_FACE_DIRECTION(fptr.m_ptr));
    }
  }

  return sha1.Hash();
}